

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  ostream *poVar2;
  double *__s;
  int iVar3;
  long lVar4;
  int iVar5;
  double dVar6;
  InterVal all;
  double adStack_7abb0 [62832];
  
  __s = (double *)&stack0xffffffffffe8fd60;
  lVar4 = 0;
  memset(__s,0,0x170270);
  memset(&stack0xffffffffffe151e0,0,0x7ab80);
  iVar3 = 0;
  iVar5 = 0;
  do {
    dVar6 = sin((double)(int)lVar4 * 0.001);
    *__s = dVar6 * 10.0;
    dVar6 = sin((double)iVar3 * 0.001);
    __s[0xf56f] = dVar6 * 20.0;
    dVar6 = sin((double)iVar5 * 0.001);
    __s[0x1eade] = dVar6 * 40.0;
    iVar5 = iVar5 + 0x28;
    iVar3 = iVar3 + 0x14;
    lVar4 = lVar4 + 10;
    __s = __s + 1;
  } while (lVar4 != 0x99656);
  lVar4 = std::chrono::_V2::system_clock::now();
  oscilator::OscilatorTools::calcNorm
            ((OscilatorSignal *)&stack0xffffffffffe8fd60,(OscilatorNorm *)&stack0xffffffffffe151e0);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Threaded exec time: ",0x14);
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - lVar4) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  lVar4 = std::chrono::_V2::system_clock::now();
  oscilator::OscilatorTools::calcNormOnInterval
            ((OscilatorSignal *)&stack0xffffffffffe8fd60,(OscilatorNorm *)&stack0xffffffffffe151e0,
             (InterVal *)&stack0xffffffffffe151d0);
  lVar1 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"One thread exec time: ",0x16);
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - lVar4) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    oscilator::OscilatorSignal signal;
    oscilator::OscilatorNorm norm;
    double a_x(10);
    double a_y(20);
    double a_z(40);

    double w_x(10);
    double w_y(20);
    double w_z(40);

    for(int i = 0; i < signal.size(); i++)
    {
        signal.getX(i) = a_x*sin(w_x * i * oscilator::SAMPLE_TIME);
        signal.getY(i) = a_y*sin(w_y * i * oscilator::SAMPLE_TIME);
        signal.getZ(i) = a_z*sin(w_z * i * oscilator::SAMPLE_TIME);
    }


    auto start = std::chrono::system_clock::now();

    oscilator::OscilatorTools::calcNorm(signal, norm);
    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end-start;
    std::cout << "Threaded exec time: " << diff.count() << std::endl;

    oscilator::InterVal all(0, norm.size());

    start = std::chrono::system_clock::now();
    // do some work
    oscilator::OscilatorTools::calcNormOnInterval(signal, norm, all);
    end = std::chrono::system_clock::now();
    diff = end-start;
    std::cout << "One thread exec time: " << diff.count() << std::endl;

    return 0;
}